

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::disableVertexAttribArray(ReferenceContext *this,deUint32 index)

{
  deBool dVar1;
  reference pvVar2;
  VertexArray *local_30;
  VertexArray *vao;
  deUint32 index_local;
  ReferenceContext *this_local;
  
  do {
    if ((uint)(this->m_limits).maxVertexAttribs <= index) {
      setError(this,0x501);
      return;
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  if (this->m_vertexArrayBinding == (VertexArray *)0x0) {
    local_30 = &this->m_clientVertexArray;
  }
  else {
    local_30 = this->m_vertexArrayBinding;
  }
  pvVar2 = std::
           vector<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
           ::operator[](&local_30->m_arrays,(ulong)index);
  pvVar2->enabled = false;
  return;
}

Assistant:

void ReferenceContext::disableVertexAttribArray (deUint32 index)
{
	RC_IF_ERROR(index >= (deUint32)m_limits.maxVertexAttribs, GL_INVALID_VALUE, RC_RET_VOID);

	rc::VertexArray& vao = (m_vertexArrayBinding) ? (*m_vertexArrayBinding) : (m_clientVertexArray);
	vao.m_arrays[index].enabled = false;
}